

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

void __thiscall font2svg::ttf_file::ttf_file(ttf_file *this)

{
  allocator<char> local_31;
  string local_30 [32];
  ttf_file *local_10;
  ttf_file *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"",&local_31);
  std::__cxx11::string::operator=((string *)this,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

ttf_file()
	{
		filename = std::string("");
	}